

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

void extraDecomposeCover(DdManager *dd,DdNode *zC,DdNode **zC0,DdNode **zC1,DdNode **zC2)

{
  DdNode *pDVar1;
  DdHalfWord local_44;
  DdHalfWord local_3c;
  DdNode *Temp;
  DdNode **zC2_local;
  DdNode **zC1_local;
  DdNode **zC0_local;
  DdNode *zC_local;
  DdManager *dd_local;
  
  if ((zC->index & 1) == 0) {
    pDVar1 = (zC->type).kids.E;
    *zC1 = (DdNode *)(zC->type).value;
    if (pDVar1->index == 0x7fffffff) {
      local_3c = pDVar1->index;
    }
    else {
      local_3c = dd->permZ[pDVar1->index];
    }
    if (zC->index == 0x7fffffff) {
      local_44 = zC->index;
    }
    else {
      local_44 = dd->permZ[zC->index];
    }
    if (local_3c == local_44 + 1) {
      *zC2 = (pDVar1->type).kids.E;
      *zC0 = (DdNode *)(pDVar1->type).value;
    }
    else {
      *zC2 = pDVar1;
      *zC0 = dd->zero;
    }
  }
  else {
    *zC1 = dd->zero;
    *zC2 = (zC->type).kids.E;
    *zC0 = (DdNode *)(zC->type).value;
  }
  return;
}

Assistant:

void 
extraDecomposeCover( 
  DdManager* dd,    /* the manager */
  DdNode*  zC,      /* the cover */
  DdNode** zC0,     /* the pointer to the negative var cofactor */ 
  DdNode** zC1,     /* the pointer to the positive var cofactor */ 
  DdNode** zC2 )    /* the pointer to the cofactor without var */ 
{
    if ( (zC->index & 1) == 0 ) 
    { /* the top variable is present in positive polarity and maybe in negative */

        DdNode *Temp = cuddE( zC );
        *zC1  = cuddT( zC );
        if ( cuddIZ(dd,Temp->index) == cuddIZ(dd,zC->index) + 1 )
        {   /* Temp is not a terminal node 
             * top var is present in negative polarity */
            *zC2 = cuddE( Temp );
            *zC0 = cuddT( Temp );
        }
        else
        {   /* top var is not present in negative polarity */
            *zC2 = Temp;
            *zC0 = dd->zero;
        }
    }
    else 
    { /* the top variable is present only in negative */
        *zC1 = dd->zero;
        *zC2 = cuddE( zC );
        *zC0 = cuddT( zC );
    }
}